

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall
amrex::MLMG::compResidual
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_res,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_rhs)

{
  long *plVar1;
  MultiFab *pMVar2;
  MultiFab *pMVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  MultiFab **ppMVar7;
  int *piVar8;
  ulong uVar9;
  MultiFab *pMVar10;
  MultiFab *pMVar11;
  long in_RDI;
  bool bVar12;
  IntVect IVar13;
  MultiFab *prhs;
  MultiFab *crse_bcdata;
  int alev_1;
  Vector<int,_std::allocator<int>_> *amrrr;
  int alev;
  IntVect ng_sol;
  int ncomp;
  MultiFab *in_stack_fffffffffffffe58;
  MultiFab *i;
  MultiFab *in_stack_fffffffffffffe60;
  MultiFab *in_stack_fffffffffffffe68;
  Any *in_stack_fffffffffffffe70;
  MultiFab *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  MultiFab *in_stack_fffffffffffffe88;
  MultiFab *pMVar14;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint uVar15;
  MultiFab *local_128;
  uint local_dc;
  undefined1 local_d0 [24];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  int local_a8 [3];
  undefined8 local_94;
  int local_8c;
  int local_88;
  undefined4 local_84;
  IntVect local_80;
  int local_74;
  int local_4c;
  IntVect *local_48;
  IntVect *local_40;
  undefined8 *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_74 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x28))();
  IntVect::IntVect(&local_80,1);
  bVar5 = MLLinOp::hasHiddenDimension((MLLinOp *)0x14fbb1b);
  if (bVar5) {
    iVar6 = MLLinOp::hiddenDirection(*(MLLinOp **)(in_RDI + 0x48));
    local_80.vect[iVar6] = 0;
    local_4c = iVar6;
    local_48 = &local_80;
  }
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (size_type)in_stack_fffffffffffffe78);
  local_84 = 1;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (size_type)in_stack_fffffffffffffe88,
             (value_type *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  for (local_88 = 0; local_88 < *(int *)(in_RDI + 0x50); local_88 = local_88 + 1) {
    bVar5 = true;
    IVar13.vect = local_a8;
    if (*(int *)(in_RDI + 0x24) != 1) {
      ppMVar7 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                          ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
      IVar13 = FabArrayBase::nGrowVect((FabArrayBase *)*ppMVar7);
      local_a8._0_8_ = IVar13.vect._0_8_;
      local_94._0_4_ = local_a8[0];
      local_94._4_4_ = local_a8[1];
      uVar4 = local_94;
      local_a8[2] = IVar13.vect[2];
      local_8c = local_a8[2];
      local_38 = &local_94;
      local_40 = &local_80;
      local_94._0_4_ = IVar13.vect[0];
      local_c = 0;
      bVar12 = (int)local_94 == local_80.vect[0];
      bVar5 = false;
      local_94 = uVar4;
      local_8 = local_40;
      if (bVar12) {
        local_94._4_4_ = IVar13.vect[1];
        local_1c = 1;
        bVar12 = local_94._4_4_ == local_80.vect[1];
        bVar5 = false;
        local_18 = local_40;
        if (bVar12) {
          local_2c = 2;
          bVar5 = local_a8[2] == local_80.vect[2];
          local_28 = local_40;
        }
      }
    }
    local_a8 = IVar13.vect;
    if (bVar5) {
      plVar1 = *(long **)(in_RDI + 0x48);
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
      Any::Any<amrex::MultiFab&>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      (**(code **)(*plVar1 + 0x150))(local_b0,plVar1,local_b8);
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffe60,
                 (size_type)in_stack_fffffffffffffe58);
      Any::operator=((Any *)in_stack_fffffffffffffe60,(Any *)in_stack_fffffffffffffe58);
      Any::~Any((Any *)0x14fbde5);
      Any::~Any((Any *)0x14fbdf2);
      piVar8 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                          (size_type)in_stack_fffffffffffffe58);
      *piVar8 = 1;
    }
    else {
      piVar8 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                          (size_type)in_stack_fffffffffffffe58);
      if (*piVar8 != 0) {
        (**(code **)(**(long **)(in_RDI + 0x48) + 0x138))
                  (local_d0,*(long **)(in_RDI + 0x48),local_88,0,&local_80);
        Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                  ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffe60,
                   (size_type)in_stack_fffffffffffffe58);
        Any::operator=((Any *)in_stack_fffffffffffffe60,(Any *)in_stack_fffffffffffffe58);
        Any::~Any((Any *)0x14fbec7);
      }
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffe60,
                 (size_type)in_stack_fffffffffffffe58);
      Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffe78);
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
      MultiFab::Copy((MultiFab *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                     (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78)
      ;
    }
  }
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    (**(code **)(**(long **)(in_RDI + 0x48) + 0xe8))();
    *(undefined1 *)(in_RDI + 0x58) = 1;
  }
  else {
    uVar9 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x38))();
    if ((uVar9 & 1) != 0) {
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x40))();
    }
  }
  MLLinOp::AMRRefRatio(*(MLLinOp **)(in_RDI + 0x48));
  for (local_dc = *(uint *)(in_RDI + 0x54); -1 < (int)local_dc; local_dc = local_dc - 1) {
    if ((int)local_dc < 1) {
      local_128 = (MultiFab *)0x0;
      i = in_stack_fffffffffffffe58;
    }
    else {
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffe60,
                 (size_type)in_stack_fffffffffffffe58);
      local_128 = Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffe78);
      i = in_stack_fffffffffffffe58;
    }
    ppMVar7 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                        ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)in_stack_fffffffffffffe60,(size_type)i);
    pMVar2 = *ppMVar7;
    plVar1 = *(long **)(in_RDI + 0x48);
    ppMVar7 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffffe60,(size_type)i);
    pMVar14 = *ppMVar7;
    Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
              ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffe60,
               (size_type)i);
    pMVar10 = Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffe78);
    (**(code **)(*plVar1 + 0x80))(plVar1,local_dc,pMVar14,pMVar10,pMVar2,local_128);
    in_stack_fffffffffffffe58 = i;
    if ((int)local_dc < *(int *)(in_RDI + 0x54)) {
      pMVar14 = *(MultiFab **)(in_RDI + 0x48);
      uVar15 = local_dc;
      ppMVar7 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                          ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           in_stack_fffffffffffffe60,(size_type)i);
      pMVar10 = *ppMVar7;
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffe60,
                 (size_type)i);
      pMVar11 = Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffe78);
      ppMVar7 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                          ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           in_stack_fffffffffffffe60,(size_type)i);
      pMVar3 = *ppMVar7;
      Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffe60,
                 (size_type)i);
      in_stack_fffffffffffffe58 = Any::get<amrex::MultiFab>((Any *)in_stack_fffffffffffffe78);
      ppMVar7 = Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            *)in_stack_fffffffffffffe60,(size_type)i);
      in_stack_fffffffffffffe60 = *ppMVar7;
      (*(pMVar14->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[0x12])
                (pMVar14,(ulong)uVar15,pMVar10,pMVar11,pMVar2,pMVar3);
      bVar5 = MLLinOp::isCellCentered(*(MLLinOp **)(in_RDI + 0x48));
      if (bVar5) {
        Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
        ppMVar7 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                             in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe78 = *ppMVar7;
        iVar6 = local_74;
        Vector<int,_std::allocator<int>_>::operator[]
                  ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                   (size_type)in_stack_fffffffffffffe58);
        EB_average_down((MultiFab *)CONCAT44(uVar15,in_stack_fffffffffffffe90),pMVar14,iVar6,
                        in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void
MLMG::compResidual (const Vector<MultiFab*>& a_res, const Vector<MultiFab*>& a_sol,
                    const Vector<MultiFab const*>& a_rhs)
{
    BL_PROFILE("MLMG::compResidual()");

    const int ncomp = linop.getNComp();
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    sol.resize(namrlevs);
    sol_is_alias.resize(namrlevs,true);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes || a_sol[alev]->nGrowVect() == ng_sol)
        {
            sol[alev] = linop.AnyMakeAlias(*a_sol[alev]);
            sol_is_alias[alev] = true;
        }
        else
        {
            if (sol_is_alias[alev])
            {
                sol[alev] = linop.AnyMake(alev, 0, ng_sol);
            }
            MultiFab::Copy(sol[alev].get<MultiFab>(), *a_sol[alev], 0, 0, ncomp, 0);
        }
    }

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();
    }

    const auto& amrrr = linop.AMRRefRatio();

    for (int alev = finest_amr_lev; alev >= 0; --alev) {
        const MultiFab* crse_bcdata = (alev > 0) ? &(sol[alev-1].get<MultiFab>()) : nullptr;
        const MultiFab* prhs = a_rhs[alev];
#if (AMREX_SPACEDIM != 3)
        int nghost = (cf_strategy == CFStrategy::ghostnodes) ? linop.getNGrow(alev) : 0;
        Any rhstmp_a(MultiFab(prhs->boxArray(), prhs->DistributionMap(), ncomp, nghost,
                              MFInfo(), *linop.Factory(alev)));
        MultiFab& rhstmp = rhstmp_a.get<MultiFab>();
        MultiFab::Copy(rhstmp, *prhs, 0, 0, ncomp, nghost);
        linop.applyMetricTerm(alev, 0, rhstmp_a);
        linop.unimposeNeumannBC(alev, rhstmp_a);
        linop.applyInhomogNeumannTerm(alev, rhstmp_a);
        prhs = &rhstmp;
#endif
        linop.solutionResidual(alev, *a_res[alev], sol[alev].get<MultiFab>(), *prhs, crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.reflux(alev, *a_res[alev], sol[alev].get<MultiFab>(), *prhs,
                         *a_res[alev+1], sol[alev+1].get<MultiFab>(), *a_rhs[alev+1]);
            if (linop.isCellCentered()) {
#ifdef AMREX_USE_EB
                amrex::EB_average_down(*a_res[alev+1], *a_res[alev], 0, ncomp, amrrr[alev]);
#else
                amrex::average_down(*a_res[alev+1], *a_res[alev], 0, ncomp, amrrr[alev]);
#endif
            }
        }
    }


#if (AMREX_SPACEDIM != 3)
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        linop.unapplyMetricTerm(alev, 0, *a_res[alev]);
    }
#endif
}